

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::SSBOBarrierCase::iterate(SSBOBarrierCase *this)

{
  int iVar1;
  int iVar2;
  GLuint GVar3;
  glGetProgramResourceIndexFunc p_Var4;
  glBindBufferFunc p_Var5;
  glBindBufferBaseFunc p_Var6;
  glUseProgramFunc p_Var7;
  glUniform1uiFunc p_Var8;
  glGetUniformLocationFunc p_Var9;
  glDispatchComputeFunc p_Var10;
  bool bVar11;
  ContextType type;
  GLSLVersion version;
  int iVar12;
  deUint32 dVar13;
  GLenum GVar14;
  GLuint GVar15;
  GLint GVar16;
  RenderContext *pRVar17;
  ostream *poVar18;
  ProgramSources *pPVar19;
  undefined4 extraout_var;
  TestLog *pTVar20;
  TestError *pTVar21;
  MessageBuilder *pMVar22;
  int *piVar23;
  void *pvVar24;
  GLuint *pGVar25;
  IVec3 *pIVar26;
  allocator<char> local_b59;
  string local_b58;
  MessageBuilder local_b38;
  int local_9b4;
  uint local_9b0;
  int ndx;
  deUint32 ref;
  deUint32 res;
  BufferMemMap bufMap_1;
  InterfaceVariableInfo valueInfo_1;
  deUint32 valueIndex_1;
  int blockSize_1;
  deUint32 blockIndex_1;
  BufferMemMap bufMap;
  int blockSize;
  deUint32 blockIndex;
  deUint32 bufferSize;
  InterfaceVariableInfo valueInfo;
  undefined1 local_8b0 [4];
  deUint32 valueIndex;
  undefined4 local_72c;
  undefined1 local_728 [4];
  deUint32 baseValue;
  Buffer outputBuffer;
  Buffer tempBuffer;
  Functions *gl;
  ShaderSource local_6d0;
  ProgramSources local_6a8;
  undefined1 local_5d8 [8];
  ShaderProgram program1;
  ShaderSource local_4e8;
  ProgramSources local_4c0;
  undefined1 local_3f0 [8];
  ShaderProgram program0;
  ostringstream src1;
  ostringstream local_198 [8];
  ostringstream src0;
  char *glslVersionDeclaration;
  GLSLVersion glslVersion;
  SSBOBarrierCase *this_local;
  Functions *gl_00;
  
  pRVar17 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar17->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  src0._368_8_ = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar18 = std::operator<<((ostream *)local_198,(char *)src0._368_8_);
  poVar18 = std::operator<<(poVar18,"\n");
  std::operator<<(poVar18,
                  "layout (local_size_x = 1) in;\nuniform uint u_baseVal;\nlayout(binding = 1) buffer Output {\n    uint values[];\n};\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    values[offset] = u_baseVal+offset;\n}\n"
                 );
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program0.m_program.m_info.linkTimeUs)
  ;
  poVar18 = std::operator<<((ostream *)&program0.m_program.m_info.linkTimeUs,(char *)src0._368_8_);
  poVar18 = std::operator<<(poVar18,"\n");
  std::operator<<(poVar18,
                  "layout (local_size_x = 1) in;\nuniform uint u_baseVal;\nlayout(binding = 1) buffer Input {\n    uint values[];\n};\nlayout(binding = 0) buffer Output {\n    coherent uint sum;\n};\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    uint value  = values[offset];\n    atomicAdd(sum, value);\n}\n"
                 );
  pRVar17 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_4c0);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource
            ((ComputeSource *)&local_4e8,(string *)&program1.m_program.m_info.linkTimeUs);
  pPVar19 = glu::ProgramSources::operator<<(&local_4c0,&local_4e8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_3f0,pRVar17,pPVar19);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_4e8);
  std::__cxx11::string::~string((string *)&program1.m_program.m_info.linkTimeUs);
  glu::ProgramSources::~ProgramSources(&local_4c0);
  pRVar17 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_6a8);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_6d0,(string *)&gl);
  pPVar19 = glu::ProgramSources::operator<<(&local_6a8,&local_6d0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_5d8,pRVar17,pPVar19);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_6d0);
  std::__cxx11::string::~string((string *)&gl);
  glu::ProgramSources::~ProgramSources(&local_6a8);
  pRVar17 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar12 = (*pRVar17->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar12);
  pRVar17 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&outputBuffer.super_ObjectWrapper.m_object,
             pRVar17);
  pRVar17 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_728,pRVar17);
  local_72c = 0x7f;
  pTVar20 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pTVar20 = glu::operator<<(pTVar20,(ShaderProgram *)local_3f0);
  glu::operator<<(pTVar20,(ShaderProgram *)local_5d8);
  bVar11 = glu::ShaderProgram::isOk((ShaderProgram *)local_3f0);
  if ((!bVar11) || (bVar11 = glu::ShaderProgram::isOk((ShaderProgram *)local_5d8), !bVar11)) {
    pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar21,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x2eb);
    __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar20 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_8b0,pTVar20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar22 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_8b0,(char (*) [14])"Work groups: ");
  pMVar22 = tcu::MessageBuilder::operator<<(pMVar22,&this->m_workSize);
  tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_8b0);
  p_Var4 = gl_00->getProgramResourceIndex;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_3f0);
  valueInfo._76_4_ = (*p_Var4)(dVar13,0x92e5,"values[0]");
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_3f0);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&blockIndex,gl_00,dVar13,0x92e5,valueInfo._76_4_);
  pIVar26 = &this->m_workSize;
  piVar23 = tcu::Vector<int,_3>::operator[](pIVar26,0);
  iVar12 = *piVar23;
  piVar23 = tcu::Vector<int,_3>::operator[](pIVar26,1);
  iVar1 = *piVar23;
  piVar23 = tcu::Vector<int,_3>::operator[](pIVar26,2);
  iVar2 = *piVar23;
  p_Var5 = gl_00->bindBuffer;
  dVar13 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&outputBuffer.super_ObjectWrapper.m_object);
  (*p_Var5)(0x90d2,dVar13);
  (*gl_00->bufferData)
            (0x90d2,(ulong)(valueInfo.arraySize * iVar12 * iVar1 * iVar2),(void *)0x0,0x88e4);
  p_Var6 = gl_00->bindBufferBase;
  dVar13 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&outputBuffer.super_ObjectWrapper.m_object);
  (*p_Var6)(0x90d2,1,dVar13);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"Temp buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x2f8);
  glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&blockIndex);
  p_Var4 = gl_00->getProgramResourceIndex;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  GVar15 = (*p_Var4)(dVar13,0x92e6,"Output");
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  bufMap.m_ptr._4_4_ = glu::getProgramResourceInt(gl_00,dVar13,0x92e6,GVar15,0x9303);
  p_Var5 = gl_00->bindBuffer;
  dVar13 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_728);
  (*p_Var5)(0x90d2,dVar13);
  (*gl_00->bufferData)(0x90d2,(long)bufMap.m_ptr._4_4_,(void *)0x0,0x88e1);
  BufferMemMap::BufferMemMap((BufferMemMap *)&blockSize_1,gl_00,0x90d2,0,bufMap.m_ptr._4_4_,2);
  pvVar24 = BufferMemMap::getPtr((BufferMemMap *)&blockSize_1);
  ::deMemset(pvVar24,0,(long)bufMap.m_ptr._4_4_);
  BufferMemMap::~BufferMemMap((BufferMemMap *)&blockSize_1);
  p_Var6 = gl_00->bindBufferBase;
  dVar13 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_728);
  (*p_Var6)(0x90d2,0,dVar13);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x309);
  p_Var7 = gl_00->useProgram;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_3f0);
  (*p_Var7)(dVar13);
  p_Var8 = gl_00->uniform1ui;
  p_Var9 = gl_00->getUniformLocation;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_3f0);
  GVar16 = (*p_Var9)(dVar13,"u_baseVal");
  (*p_Var8)(GVar16,0x7f);
  p_Var10 = gl_00->dispatchCompute;
  pIVar26 = &this->m_workSize;
  pGVar25 = (GLuint *)tcu::Vector<int,_3>::operator[](pIVar26,0);
  GVar15 = *pGVar25;
  pGVar25 = (GLuint *)tcu::Vector<int,_3>::operator[](pIVar26,1);
  GVar3 = *pGVar25;
  pGVar25 = (GLuint *)tcu::Vector<int,_3>::operator[](pIVar26,2);
  (*p_Var10)(GVar15,GVar3,*pGVar25);
  (*gl_00->memoryBarrier)(0x2000);
  p_Var7 = gl_00->useProgram;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  (*p_Var7)(dVar13);
  p_Var10 = gl_00->dispatchCompute;
  pIVar26 = &this->m_workSize;
  pGVar25 = (GLuint *)tcu::Vector<int,_3>::operator[](pIVar26,0);
  GVar15 = *pGVar25;
  pGVar25 = (GLuint *)tcu::Vector<int,_3>::operator[](pIVar26,1);
  GVar3 = *pGVar25;
  pGVar25 = (GLuint *)tcu::Vector<int,_3>::operator[](pIVar26,2);
  (*p_Var10)(GVar15,GVar3,*pGVar25);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"Failed to dispatch commands",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x313);
  p_Var4 = gl_00->getProgramResourceIndex;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  GVar15 = (*p_Var4)(dVar13,0x92e6,"Output");
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  iVar12 = glu::getProgramResourceInt(gl_00,dVar13,0x92e6,GVar15,0x9303);
  p_Var4 = gl_00->getProgramResourceIndex;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  GVar15 = (*p_Var4)(dVar13,0x92e5,"sum");
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&bufMap_1.m_ptr,gl_00,dVar13,0x92e5,GVar15);
  BufferMemMap::BufferMemMap((BufferMemMap *)&ref,gl_00,0x90d2,0,iVar12,1);
  pvVar24 = BufferMemMap::getPtr((BufferMemMap *)&ref);
  ndx = *(int *)((long)pvVar24 + (ulong)valueInfo_1.type);
  local_9b0 = 0;
  local_9b4 = 0;
  while( true ) {
    iVar2 = local_9b4;
    piVar23 = tcu::Vector<int,_3>::operator[](&this->m_workSize,0);
    iVar12 = *piVar23;
    piVar23 = tcu::Vector<int,_3>::operator[](&this->m_workSize,1);
    iVar1 = *piVar23;
    piVar23 = tcu::Vector<int,_3>::operator[](&this->m_workSize,2);
    if (iVar12 * iVar1 * *piVar23 <= iVar2) break;
    local_9b0 = local_9b4 + 0x7f + local_9b0;
    local_9b4 = local_9b4 + 1;
  }
  if (ndx == local_9b0) {
    BufferMemMap::~BufferMemMap((BufferMemMap *)&ref);
    glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&bufMap_1.m_ptr);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)local_728);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)&outputBuffer.super_ObjectWrapper.m_object)
    ;
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_5d8);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_3f0);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&program0.m_program.m_info.linkTimeUs);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    return STOP;
  }
  pTVar20 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_b38,pTVar20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar22 = tcu::MessageBuilder::operator<<
                      (&local_b38,(char (*) [36])"ERROR: comparison failed, expected ");
  pMVar22 = tcu::MessageBuilder::operator<<(pMVar22,&local_9b0);
  pMVar22 = tcu::MessageBuilder::operator<<(pMVar22,(char (*) [7])0x2c67b94);
  pMVar22 = tcu::MessageBuilder::operator<<(pMVar22,(uint *)&ndx);
  tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b38);
  pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,"Comparison failed",&local_b59);
  tcu::TestError::TestError(pTVar21,&local_b58);
  __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion				= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		const char* const	glslVersionDeclaration	= getGLSLVersionDeclaration(glslVersion);

		std::ostringstream src0;
		src0 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "uniform uint u_baseVal;\n"
						  "layout(binding = 1) buffer Output {\n"
						  "    uint values[];\n"
						  "};\n"
						  "void main (void) {\n"
						  "    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
						  "    values[offset] = u_baseVal+offset;\n"
				"}\n";

		std::ostringstream src1;
		src1 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "uniform uint u_baseVal;\n"
						  "layout(binding = 1) buffer Input {\n"
						  "    uint values[];\n"
						  "};\n"
						  "layout(binding = 0) buffer Output {\n"
						  "    coherent uint sum;\n"
						  "};\n"
						  "void main (void) {\n"
						  "    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
						  "    uint value  = values[offset];\n"
						  "    atomicAdd(sum, value);\n"
				"}\n";

		const ShaderProgram			program0		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src0.str()));
		const ShaderProgram			program1		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src1.str()));

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				tempBuffer		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const deUint32				baseValue		= 127;

		m_testCtx.getLog() << program0 << program1;
		if (!program0.isOk() || !program1.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		// Temp buffer setup
		{
			const deUint32				valueIndex		= gl.getProgramResourceIndex(program0.getProgram(), GL_BUFFER_VARIABLE, "values[0]");
			const InterfaceVariableInfo	valueInfo		= getProgramInterfaceVariableInfo(gl, program0.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const deUint32				bufferSize		= valueInfo.arrayStride*m_workSize[0]*m_workSize[1]*m_workSize[2];

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *tempBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)bufferSize, DE_NULL, GL_STATIC_DRAW);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *tempBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Temp buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_WRITE_BIT);
				deMemset(bufMap.getPtr(), 0, blockSize);
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.useProgram(program0.getProgram());
		gl.uniform1ui(gl.getUniformLocation(program0.getProgram(), "u_baseVal"), baseValue);
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		gl.memoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		gl.useProgram(program1.getProgram());
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch commands");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_BUFFER_VARIABLE, "sum");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program1.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			const deUint32				res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset));
			deUint32					ref			= 0;

			for (int ndx = 0; ndx < m_workSize[0]*m_workSize[1]*m_workSize[2]; ndx++)
				ref += baseValue + (deUint32)ndx;

			if (res != ref)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed, expected " << ref << ", got " << res << TestLog::EndMessage;
				throw tcu::TestError("Comparison failed");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}